

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  char *parameterName;
  uint uVar4;
  uint local_5c;
  SimpleString argument;
  SimpleString local_48;
  TestPlugin *local_38;
  
  uVar4 = 1;
  uVar3 = 1;
  local_38 = plugin;
  while (iVar1 = this->ac_, (int)uVar3 < iVar1) {
    local_5c = uVar3;
    SimpleString::SimpleString(&argument,this->av_[(int)uVar3]);
    SimpleString::SimpleString(&local_48,"-h");
    bVar2 = operator==(&argument,&local_48);
    SimpleString::~SimpleString(&local_48);
    if (bVar2) {
      this->needHelp_ = true;
LAB_00137099:
      uVar4 = 0;
    }
    else {
      SimpleString::SimpleString(&local_48,"-v");
      bVar2 = operator==(&argument,&local_48);
      SimpleString::~SimpleString(&local_48);
      if (bVar2) {
        this->verbose_ = true;
      }
      else {
        SimpleString::SimpleString(&local_48,"-vv");
        bVar2 = operator==(&argument,&local_48);
        SimpleString::~SimpleString(&local_48);
        if (bVar2) {
          this->veryVerbose_ = true;
        }
        else {
          SimpleString::SimpleString(&local_48,"-c");
          bVar2 = operator==(&argument,&local_48);
          SimpleString::~SimpleString(&local_48);
          if (bVar2) {
            this->color_ = true;
          }
          else {
            SimpleString::SimpleString(&local_48,"-p");
            bVar2 = operator==(&argument,&local_48);
            SimpleString::~SimpleString(&local_48);
            if (bVar2) {
              this->runTestsAsSeperateProcess_ = true;
            }
            else {
              SimpleString::SimpleString(&local_48,"-b");
              bVar2 = operator==(&argument,&local_48);
              SimpleString::~SimpleString(&local_48);
              if (bVar2) {
                this->reversing_ = true;
              }
              else {
                SimpleString::SimpleString(&local_48,"-lg");
                bVar2 = operator==(&argument,&local_48);
                SimpleString::~SimpleString(&local_48);
                if (bVar2) {
                  this->listTestGroupNames_ = true;
                }
                else {
                  SimpleString::SimpleString(&local_48,"-ln");
                  bVar2 = operator==(&argument,&local_48);
                  SimpleString::~SimpleString(&local_48);
                  if (bVar2) {
                    this->listTestGroupAndCaseNames_ = true;
                  }
                  else {
                    SimpleString::SimpleString(&local_48,"-ri");
                    bVar2 = operator==(&argument,&local_48);
                    SimpleString::~SimpleString(&local_48);
                    if (bVar2) {
                      this->runIgnored_ = true;
                    }
                    else {
                      SimpleString::SimpleString(&local_48,"-r");
                      bVar2 = SimpleString::startsWith(&argument,&local_48);
                      SimpleString::~SimpleString(&local_48);
                      if (bVar2) {
                        setRepeatCount(this,this->ac_,this->av_,(int *)&local_5c);
                      }
                      else {
                        SimpleString::SimpleString(&local_48,"-g");
                        bVar2 = SimpleString::startsWith(&argument,&local_48);
                        SimpleString::~SimpleString(&local_48);
                        if (bVar2) {
                          addGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                        }
                        else {
                          SimpleString::SimpleString(&local_48,"-t");
                          bVar2 = SimpleString::startsWith(&argument,&local_48);
                          SimpleString::~SimpleString(&local_48);
                          if (bVar2) {
                            bVar2 = addGroupDotNameFilter(this,this->ac_,this->av_,(int *)&local_5c)
                            ;
                            uVar4 = (uint)bVar2;
                          }
                          else {
                            SimpleString::SimpleString(&local_48,"-sg");
                            bVar2 = SimpleString::startsWith(&argument,&local_48);
                            SimpleString::~SimpleString(&local_48);
                            if (bVar2) {
                              addStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                            }
                            else {
                              SimpleString::SimpleString(&local_48,"-xg");
                              bVar2 = SimpleString::startsWith(&argument,&local_48);
                              SimpleString::~SimpleString(&local_48);
                              if (bVar2) {
                                addExcludeGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                              }
                              else {
                                SimpleString::SimpleString(&local_48,"-xsg");
                                bVar2 = SimpleString::startsWith(&argument,&local_48);
                                SimpleString::~SimpleString(&local_48);
                                if (bVar2) {
                                  addExcludeStrictGroupFilter
                                            (this,this->ac_,this->av_,(int *)&local_5c);
                                }
                                else {
                                  SimpleString::SimpleString(&local_48,"-n");
                                  bVar2 = SimpleString::startsWith(&argument,&local_48);
                                  SimpleString::~SimpleString(&local_48);
                                  if (bVar2) {
                                    addNameFilter(this,this->ac_,this->av_,(int *)&local_5c);
                                  }
                                  else {
                                    SimpleString::SimpleString(&local_48,"-sn");
                                    bVar2 = SimpleString::startsWith(&argument,&local_48);
                                    SimpleString::~SimpleString(&local_48);
                                    if (bVar2) {
                                      addStrictNameFilter(this,this->ac_,this->av_,(int *)&local_5c)
                                      ;
                                    }
                                    else {
                                      SimpleString::SimpleString(&local_48,"-xn");
                                      bVar2 = SimpleString::startsWith(&argument,&local_48);
                                      SimpleString::~SimpleString(&local_48);
                                      if (bVar2) {
                                        addExcludeNameFilter
                                                  (this,this->ac_,this->av_,(int *)&local_5c);
                                      }
                                      else {
                                        SimpleString::SimpleString(&local_48,"-xsn");
                                        bVar2 = SimpleString::startsWith(&argument,&local_48);
                                        SimpleString::~SimpleString(&local_48);
                                        if (bVar2) {
                                          addExcludeStrictNameFilter
                                                    (this,this->ac_,this->av_,(int *)&local_5c);
                                        }
                                        else {
                                          SimpleString::SimpleString(&local_48,"-s");
                                          bVar2 = SimpleString::startsWith(&argument,&local_48);
                                          SimpleString::~SimpleString(&local_48);
                                          if (bVar2) {
                                            bVar2 = setShuffle(this,this->ac_,this->av_,
                                                               (int *)&local_5c);
                                            uVar4 = (uint)bVar2;
                                          }
                                          else {
                                            SimpleString::SimpleString(&local_48,"TEST(");
                                            bVar2 = SimpleString::startsWith(&argument,&local_48);
                                            SimpleString::~SimpleString(&local_48);
                                            parameterName = "TEST(";
                                            if (!bVar2) {
                                              SimpleString::SimpleString(&local_48,"IGNORE_TEST(");
                                              bVar2 = SimpleString::startsWith(&argument,&local_48);
                                              SimpleString::~SimpleString(&local_48);
                                              parameterName = "IGNORE_TEST(";
                                              if (!bVar2) {
                                                SimpleString::SimpleString(&local_48,"-o");
                                                bVar2 = SimpleString::startsWith
                                                                  (&argument,&local_48);
                                                SimpleString::~SimpleString(&local_48);
                                                if (bVar2) {
                                                  bVar2 = setOutputType(this,this->ac_,this->av_,
                                                                        (int *)&local_5c);
                                                  uVar4 = (uint)bVar2;
                                                }
                                                else {
                                                  SimpleString::SimpleString(&local_48,"-p");
                                                  bVar2 = SimpleString::startsWith
                                                                    (&argument,&local_48);
                                                  SimpleString::~SimpleString(&local_48);
                                                  if (bVar2) {
                                                    uVar4 = (*local_38->_vptr_TestPlugin[7])
                                                                      (local_38,(ulong)(uint)this->
                                                  ac_,this->av_,(ulong)uVar3);
                                                  }
                                                  else {
                                                    SimpleString::SimpleString(&local_48,"-k");
                                                    bVar2 = SimpleString::startsWith
                                                                      (&argument,&local_48);
                                                    SimpleString::~SimpleString(&local_48);
                                                    if (!bVar2) goto LAB_00137099;
                                                    setPackageName(this,this->ac_,this->av_,
                                                                   (int *)&local_5c);
                                                  }
                                                }
                                                goto LAB_00137249;
                                              }
                                            }
                                            addTestToRunBasedOnVerboseOutput
                                                      (this,this->ac_,this->av_,(int *)&local_5c,
                                                       parameterName);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00137249:
    SimpleString::~SimpleString(&argument);
    if ((uVar4 & 1) == 0) break;
    uVar3 = local_5c + 1;
  }
  return iVar1 <= (int)uVar3;
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if (argument == "-h") {
            needHelp_ = true;
            correctParameters = false;
        }
        else if (argument == "-v") verbose_ = true;
        else if (argument == "-vv") veryVerbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-b") reversing_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) setRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) addGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-t")) correctParameters = addGroupDotNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) addStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) addExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) addExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) addNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) addStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) addExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) addExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-s")) correctParameters = setShuffle(ac_, av_, i);
        else if (argument.startsWith("TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = setOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) setPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}